

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadFunctionSignatures(WasmBinaryReader *this)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  uint32 uVar4;
  WasmSignature *sig_00;
  WasmSignature *sig;
  uint local_20;
  uint32 sigIndex;
  uint32 iFunc;
  uint32 totalFunctions;
  uint32 nFunctions;
  uint32 len;
  WasmBinaryReader *this_local;
  
  totalFunctions = 0;
  _nFunctions = this;
  uVar2 = LEB128<unsigned_int,32u>(this,&totalFunctions);
  sigIndex = 0;
  iFunc = uVar2;
  uVar3 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
  bVar1 = UInt32Math::Add(uVar2,uVar3,&sigIndex);
  uVar3 = sigIndex;
  if (!bVar1) {
    uVar4 = Limits::GetMaxFunctions();
    if (uVar3 <= uVar4) {
      local_20 = 0;
      while( true ) {
        if (iFunc <= local_20) {
          return;
        }
        uVar2 = LEB128<unsigned_int,32u>(this,&totalFunctions);
        uVar3 = Js::WebAssemblyModule::GetSignatureCount(this->m_module);
        if (uVar3 <= uVar2) break;
        sig_00 = Js::WebAssemblyModule::GetSignature(this->m_module,uVar2);
        Js::WebAssemblyModule::AddWasmFunctionInfo(this->m_module,sig_00);
        local_20 = local_20 + 1;
      }
      ThrowDecodingError(this,L"Function signature is out of bound");
    }
  }
  ThrowDecodingError(this,L"Too many functions");
}

Assistant:

void WasmBinaryReader::ReadFunctionSignatures()
{
    uint32 len = 0;
    uint32 nFunctions = LEB128(len);

    uint32 totalFunctions = 0;
    if (UInt32Math::Add(nFunctions, m_module->GetWasmFunctionCount(), &totalFunctions) || totalFunctions > Limits::GetMaxFunctions())
    {
        ThrowDecodingError(_u("Too many functions"));
    }

    for (uint32 iFunc = 0; iFunc < nFunctions; iFunc++)
    {
        uint32 sigIndex = LEB128(len);
        if (sigIndex >= m_module->GetSignatureCount())
        {
            ThrowDecodingError(_u("Function signature is out of bound"));
        }

        WasmSignature* sig = m_module->GetSignature(sigIndex);
        m_module->AddWasmFunctionInfo(sig);
    }
}